

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::VirtualInterfaceTypeSyntax::setChild
          (VirtualInterfaceTypeSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004fe954 + *(int *)(&DAT_004fe954 + index * 4)))();
  return;
}

Assistant:

void VirtualInterfaceTypeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: virtualKeyword = child.token(); return;
        case 1: interfaceKeyword = child.token(); return;
        case 2: name = child.token(); return;
        case 3: parameters = child.node() ? &child.node()->as<ParameterValueAssignmentSyntax>() : nullptr; return;
        case 4: modport = child.node() ? &child.node()->as<DotMemberClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}